

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

void __thiscall xLearn::Solver::checker(Solver *this,int argc,char **argv)

{
  bool bVar1;
  allocator local_31;
  string local_30;
  
  Checker::Initialize(&this->checker_,(this->hyper_param_).is_train,argc,argv);
  bVar1 = Checker::check_cmd(&this->checker_,&this->hyper_param_);
  if (bVar1) {
    return;
  }
  std::__cxx11::string::string((string *)&local_30,"Arguments error",&local_31);
  Color::print_error(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  exit(0);
}

Assistant:

void Solver::checker(int argc, char* argv[]) {
  try {
    checker_.Initialize(hyper_param_.is_train, argc, argv);
    if (!checker_.check_cmd(hyper_param_)) {
      Color::print_error("Arguments error");
      exit(0);
    }
  } catch (std::invalid_argument &e) {
    printf("%s\n", e.what());
    exit(1);
  }
}